

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O0

void av1_highbd_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined4 uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  double dVar7;
  double dVar8;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000020;
  int in_stack_00000028;
  int xx;
  int yy;
  int jj;
  int ii;
  uint j;
  uint k;
  uint i;
  double decay_factor;
  double n_decay;
  double inv_num_ref_pixels;
  int num_ref_pixels;
  int ss_y_shift;
  int ss_x_shift;
  uint16_t *ref;
  int frame_offset;
  uint32_t frame_stride;
  uint32_t plane_w;
  uint32_t plane_h;
  int plane;
  int plane_offset;
  double distance_threshold;
  double distance;
  MV mv;
  int subblock_idx;
  uint16_t *pred1;
  uint32_t luma_sse_sum [1024];
  uint32_t frame_sse [1152];
  double d_factor [4];
  double s_decay;
  double q_decay;
  double weight_factor;
  double inv_factor;
  int min_frame_size;
  int frame_width;
  int frame_height;
  int mb_width;
  int mb_height;
  int is_high_bitdepth;
  double local_2368;
  double local_2360;
  double local_2350;
  double local_2348;
  double local_2340;
  double local_2338;
  int local_2330;
  int local_2324;
  int local_2320;
  uint local_231c;
  uint local_2314;
  int local_22d0;
  short local_22b8;
  short sStackY_22b6;
  int local_22b4;
  int local_22a8 [1024];
  int local_12a8 [112];
  double in_stack_ffffffffffffef18;
  double in_stack_ffffffffffffef20;
  double in_stack_ffffffffffffef28;
  double in_stack_ffffffffffffef30;
  int in_stack_ffffffffffffef3c;
  int in_stack_ffffffffffffef40;
  uint in_stack_ffffffffffffef44;
  uint16_t *in_stack_ffffffffffffef48;
  uint in_stack_ffffffffffffef54;
  uint16_t *in_stack_ffffffffffffef58;
  int *in_stack_fffffffffffff170;
  uint *in_stack_fffffffffffff178;
  uint16_t *in_stack_fffffffffffff180;
  uint32_t *in_stack_fffffffffffff188;
  uint32_t *in_stack_fffffffffffff190;
  int in_stack_fffffffffffff198;
  double *in_stack_fffffffffffff1a0;
  int in_stack_fffffffffffff1a8;
  double local_a8 [5];
  double local_80;
  double local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  int local_48;
  long local_38;
  
  local_4c = *(uint *)(in_RDI + 0xc0) & 8;
  local_50 = (uint)block_size_high[in_DL];
  local_54 = (uint)block_size_wide[in_DL];
  local_58 = *(int *)(in_RDI + 0x18);
  local_5c = *(int *)(in_RDI + 0x10);
  local_2330 = local_5c;
  if (local_58 < local_5c) {
    local_2330 = local_58;
  }
  local_60 = local_2330;
  local_68 = 0x3f81111111111111;
  local_70 = 0x3fa5555555555555;
  local_48 = in_R9D;
  local_38 = in_RSI;
  local_2340 = pow((double)in_stack_00000020 / 20.0,2.0);
  if (1e-05 <= local_2340) {
    if (1.0 < local_2340) {
      local_2340 = 1.0;
    }
    local_2338 = local_2340;
  }
  else {
    local_2338 = 1e-05;
  }
  local_78 = local_2338;
  if (0x7f < in_stack_00000020) {
    local_78 = pow((double)in_stack_00000020 / 64.0,2.0);
    local_78 = local_78 * 0.5;
  }
  local_2350 = pow((double)in_stack_00000028 / 4.0,2.0);
  if (1e-05 <= local_2350) {
    if (1.0 < local_2350) {
      local_2350 = 1.0;
    }
    local_2348 = local_2350;
  }
  else {
    local_2348 = 1e-05;
  }
  local_80 = local_2348;
  memset(local_a8,0,0x20);
  memset(local_12a8,0,0x1200);
  memset(local_22a8,0,0x1000);
  for (local_22b4 = 0; local_22b4 < 4; local_22b4 = local_22b4 + 1) {
    uVar1 = *(undefined4 *)(in_stack_00000010 + (long)local_22b4 * 4);
    local_22b8 = (short)uVar1;
    dVar7 = pow((double)(int)local_22b8,2.0);
    sStackY_22b6 = (short)((uint)uVar1 >> 0x10);
    dVar8 = pow((double)(int)sStackY_22b6,2.0);
    dVar7 = sqrt(dVar7 + dVar8);
    local_2360 = (double)local_60 * 0.1;
    if (local_2360 <= 1.0) {
      local_2360 = 1.0;
    }
    local_a8[local_22b4] = dVar7 / local_2360;
    if (local_a8[local_22b4] <= 1.0) {
      local_2368 = 1.0;
    }
    else {
      local_2368 = local_a8[local_22b4];
    }
    local_a8[local_22b4] = local_2368;
  }
  for (local_22d0 = 0; local_22d0 < local_48; local_22d0 = local_22d0 + 1) {
    uVar4 = (int)local_50 >>
            ((byte)*(undefined4 *)(local_38 + (long)local_22d0 * 0xa30 + 0x18) & 0x1f);
    uVar5 = (int)local_54 >>
            ((byte)*(undefined4 *)(local_38 + (long)local_22d0 * 0xa30 + 0x14) & 0x1f);
    bVar2 = (char)*(undefined4 *)(local_38 + (long)local_22d0 * 0xa30 + 0x14) -
            (char)*(undefined4 *)(local_38 + 0x14);
    bVar3 = (char)*(undefined4 *)(local_38 + (long)local_22d0 * 0xa30 + 0x18) -
            (char)*(undefined4 *)(local_38 + 0x18);
    dVar7 = *(double *)(in_stack_00000008 + (long)local_22d0 * 8);
    log(dVar7 + dVar7 + 5.0);
    if (local_22d0 == 1) {
      for (local_2314 = 0; local_2314 < uVar4; local_2314 = local_2314 + 1) {
        for (local_231c = 0; local_231c < uVar5; local_231c = local_231c + 1) {
          for (local_2320 = 0; local_2320 < 1 << (bVar3 & 0x1f); local_2320 = local_2320 + 1) {
            for (local_2324 = 0; local_2324 < 1 << (bVar2 & 0x1f); local_2324 = local_2324 + 1) {
              uVar6 = local_2314 * 0x20 + local_231c;
              local_22a8[uVar6] =
                   local_12a8
                   [(int)(((local_2314 << (bVar3 & 0x1f)) + local_2320) * 0x24 +
                          (local_231c << (bVar2 & 0x1f)) + local_2324 + 2)] + local_22a8[uVar6];
            }
          }
        }
      }
    }
    highbd_apply_temporal_filter
              (in_stack_ffffffffffffef58,in_stack_ffffffffffffef54,in_stack_ffffffffffffef48,
               in_stack_ffffffffffffef44,in_stack_ffffffffffffef40,in_stack_ffffffffffffef3c,
               in_stack_fffffffffffff170,in_stack_fffffffffffff178,in_stack_fffffffffffff180,
               in_stack_fffffffffffff188,in_stack_fffffffffffff190,in_stack_fffffffffffff198,
               in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
               in_stack_ffffffffffffef18,in_stack_fffffffffffff1a0,in_stack_fffffffffffff1a8);
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[0].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[0].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}